

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O3

int32 make_mdef_from_list(char *mdeffile,char **CIlist,int32 nciphones,heapelement_t **CDheap,
                         int32 cdheapsize,char *pgm)

{
  uint32 *puVar1;
  char **__ptr;
  acmod_id_t aVar2;
  uint uVar3;
  acmod_id_t left_context;
  acmod_id_t right_context;
  word_posn_t posn;
  cmd_ln_t *cmdln;
  char **ppcVar4;
  ulong uVar5;
  char *pcVar6;
  heapelement_t *heapel;
  acmod_set_t *acmod_set;
  FILE *__stream;
  char **ppcVar7;
  char *fmt;
  int iVar8;
  char **ppcVar9;
  uint32 uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32 uVar13;
  size_t n_elem;
  ulong uVar14;
  long lVar15;
  int32 cdheapsize_local;
  char **local_f8;
  char *local_f0;
  char **local_e8;
  char **local_e0;
  char **local_d8;
  char **local_d0;
  uint32 **local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  uint32 *local_a8;
  ulong local_a0;
  char **local_98;
  ulong local_90;
  char *local_88;
  char **local_80;
  uint32 *local_78;
  heapelement_t **CDheap_local;
  char *na_attr [2];
  char *base_attr [2];
  char *filler_attr [2];
  
  uVar12 = (ulong)(uint)cdheapsize;
  uVar14 = (ulong)(uint)nciphones;
  filler_attr[0] = "filler";
  filler_attr[1] = (char *)0x0;
  base_attr[0] = "base";
  base_attr[1] = (char *)0x0;
  na_attr[0] = "n/a";
  na_attr[1] = (char *)0x0;
  cdheapsize_local = cdheapsize;
  local_f0 = mdeffile;
  local_88 = pgm;
  CDheap_local = CDheap;
  cmdln = cmd_ln_get();
  local_b0 = cmd_ln_int_r(cmdln,"-n_state_pm");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x381,"%d n_base, %d n_tri\n",uVar14,uVar12);
  local_b8 = (ulong)(uint)(cdheapsize + nciphones);
  n_elem = (size_t)(cdheapsize + nciphones);
  ppcVar4 = (char **)__ckd_calloc__(n_elem,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                    ,0x388);
  local_e0 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x389);
  local_e8 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x38a);
  local_d0 = (char **)__ckd_calloc__(n_elem,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0x38b);
  local_a8 = (uint32 *)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                            ,0x38d);
  local_c8 = (uint32 **)
             __ckd_calloc_2d__(n_elem,(long)(int)local_b0,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                               ,0x38f);
  uVar5 = (ulong)(uint)nciphones;
  local_c0 = uVar14;
  if (nciphones < 1) {
    uVar14 = 0;
  }
  else {
    uVar11 = 0;
    do {
      pcVar6 = strdup(CIlist[uVar11]);
      ppcVar4[uVar11] = pcVar6;
      uVar11 = uVar11 + 1;
      uVar14 = uVar5;
    } while (uVar5 != uVar11);
  }
  ppcVar7 = local_e0;
  ppcVar9 = local_e8;
  uVar11 = (ulong)(uint)cdheapsize;
  uVar13 = cdheapsize;
  local_d8 = ppcVar4;
  local_a0 = uVar12;
  if (0 < cdheapsize) {
    local_f8 = local_d0 + uVar14;
    lVar15 = 0;
    do {
      heapel = yanktop(&CDheap_local,cdheapsize_local,&cdheapsize_local);
      pcVar6 = strdup(heapel->basephone);
      ppcVar4[uVar14 + lVar15] = pcVar6;
      pcVar6 = strdup(heapel->leftcontext);
      ppcVar7[uVar14 + lVar15] = pcVar6;
      pcVar6 = strdup(heapel->rightcontext);
      ppcVar9[uVar14 + lVar15] = pcVar6;
      pcVar6 = strdup(heapel->wordposition);
      local_f8[lVar15] = pcVar6;
      free_heapelement(heapel);
      lVar15 = lVar15 + 1;
    } while (cdheapsize != (int)lVar15);
    uVar13 = (uint32)local_a0;
    cdheapsize = cdheapsize_local;
  }
  ppcVar4 = local_d8;
  if (cdheapsize == 0) {
    ppcVar9 = (char **)(local_b8 & 0xffffffff);
    if (0 < (int)local_b8) {
      ppcVar7 = (char **)0x0;
      iVar8 = 0;
      do {
        if (0 < (int)(uint)local_b0) {
          puVar1 = local_c8[(long)ppcVar7];
          uVar12 = 0;
          do {
            puVar1[uVar12] = iVar8 + (int)uVar12;
            uVar12 = uVar12 + 1;
          } while (((uint)local_b0 & 0x7fffffff) != uVar12);
          iVar8 = iVar8 + (int)uVar12;
        }
        ppcVar7 = (char **)((long)ppcVar7 + 1);
      } while (ppcVar7 != ppcVar9);
    }
    local_90 = uVar11;
    acmod_set = acmod_set_new();
    uVar10 = (uint32)local_c0;
    acmod_set_set_n_ci_hint(acmod_set,uVar10);
    acmod_set_set_n_tri_hint(acmod_set,uVar13);
    if ((int)uVar10 < 1) {
      uVar3 = 0;
    }
    else {
      uVar12 = 0;
      local_f8 = ppcVar9;
      do {
        ppcVar9 = filler_attr;
        if (*ppcVar4[uVar12] != '+') {
          ppcVar9 = base_attr;
        }
        aVar2 = acmod_set_add_ci(acmod_set,ppcVar4[uVar12],ppcVar9);
        local_a8[aVar2] = aVar2;
        uVar12 = uVar12 + 1;
      } while (uVar5 != uVar12);
      uVar3 = (uint)local_c0;
      ppcVar9 = local_f8;
    }
    ppcVar4 = local_d8;
    if ((int)uVar3 < (int)local_b8) {
      uVar5 = (ulong)uVar3;
      local_98 = local_e8 + uVar5;
      local_f8 = local_e0 + uVar5;
      local_78 = local_a8 + uVar5;
      local_80 = local_d0 + uVar5;
      lVar15 = 0;
      do {
        aVar2 = acmod_set_name2id(acmod_set,ppcVar4[uVar5 + lVar15]);
        if (aVar2 == 0xffffffff) {
          pcVar6 = ppcVar4[uVar5 + lVar15];
          fmt = "Error in dictionary or phonelist. Bad basephone %s in triphone list!\n";
          lVar15 = 0x3b5;
          goto LAB_00105a84;
        }
        left_context = acmod_set_name2id(acmod_set,local_f8[lVar15]);
        if (left_context == 0xffffffff) {
          pcVar6 = local_f8[lVar15];
          fmt = "Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n";
          lVar15 = 0x3b7;
          goto LAB_00105a84;
        }
        right_context = acmod_set_name2id(acmod_set,local_98[lVar15]);
        if (right_context == 0xffffffff) {
          pcVar6 = local_98[lVar15];
          fmt = "Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n";
          lVar15 = 0x3b9;
          goto LAB_00105a84;
        }
        posn = posnstr2wordpos(local_80[lVar15]);
        acmod_set_add_tri(acmod_set,aVar2,left_context,right_context,posn,na_attr);
        local_78[lVar15] = aVar2;
        lVar15 = lVar15 + 1;
      } while ((long)ppcVar9 - uVar5 != lVar15);
    }
    __stream = fopen(local_f0,"w");
    __ptr = local_d0;
    ppcVar7 = local_d8;
    ppcVar9 = local_e0;
    ppcVar4 = local_e8;
    if (__stream != (FILE *)0x0) {
      iVar8 = (int)local_b0;
      uVar13 = (uint32)local_c0;
      uVar10 = (uint32)local_a0;
      output_model_def((FILE *)__stream,local_88,local_d8,local_e0,local_e8,local_d0,local_a8,
                       local_c8,uVar13,uVar10,(uint32)local_b8,iVar8 + 1,(uint32)local_b8 * iVar8,
                       iVar8 * uVar13,uVar13);
      fclose(__stream);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x3c9,"Wrote mdef file %s\n",local_f0);
      uVar5 = local_90;
      if (0 < (int)uVar10) {
        uVar12 = 0;
        do {
          pcVar6 = ppcVar7[uVar12];
          if (pcVar6 != (char *)0x0) {
            free(pcVar6);
          }
          pcVar6 = ppcVar9[uVar12];
          if (pcVar6 != (char *)0x0) {
            free(pcVar6);
          }
          pcVar6 = ppcVar4[uVar12];
          if (pcVar6 != (char *)0x0) {
            free(pcVar6);
          }
          pcVar6 = __ptr[uVar12];
          if (pcVar6 != (char *)0x0) {
            free(pcVar6);
          }
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
      free(ppcVar7);
      free(ppcVar9);
      free(ppcVar4);
      free(__ptr);
      ckd_free_2d(local_c8);
      return 0;
    }
    fmt = "Unable to open %s for writing!\n";
    lVar15 = 0x3c2;
    pcVar6 = local_f0;
LAB_00105a84:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,lVar15,fmt,pcVar6);
  }
  else {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x39e,"Error in CD heap! Error in dictionary or phone list!\n");
  }
  exit(1);
}

Assistant:

int32 make_mdef_from_list(const char *mdeffile,
			char **CIlist, 
			int32  nciphones,
			heapelement_t **CDheap,
			int32  cdheapsize,
			char  *pgm)
{
    int32  n_base, n_tri, n_state_pm, n_total;
    int32  n_tied_state_ci, n_tied_state_cd, n_tied_tmat;
    char   **base_str, **left_str, **right_str, **posn_str;
    acmod_id_t base, left, right;
    word_posn_t posn;
    acmod_set_t  *acmod_set;
    int32 i,j,k;
    const char *filler_attr[] = {"filler", NULL};
    const char *base_attr[] = {"base", NULL};
    const char *na_attr[] = {"n/a", NULL};
    uint32 *tmat; 
    uint32 **smap;
    heapelement_t *cdphone;
    FILE  *fp;

    n_state_pm = cmd_ln_int32("-n_state_pm") + 1;
    n_base = nciphones;
    n_tri = cdheapsize;
    E_INFO("%d n_base, %d n_tri\n", n_base, n_tri);

    n_tied_state_ci = n_base * (n_state_pm-1);
    n_tied_state_cd = n_tri * (n_state_pm-1);
    n_tied_tmat = n_base;

    n_total = n_base + n_tri;
    base_str = ckd_calloc(n_total, sizeof(char *));
    left_str = ckd_calloc(n_total, sizeof(char *));
    right_str = ckd_calloc(n_total, sizeof(char *));
    posn_str = ckd_calloc(n_total, sizeof(char *));

    tmat = ckd_calloc(n_total, sizeof(uint32));

    smap = (uint32 **)ckd_calloc_2d(n_total, n_state_pm-1, sizeof(uint32));

    for (i = 0; i < n_base; i++) {
        base_str[i] = strdup(CIlist[i]);
    }

    for (j = 0; j < n_tri; j++,i++) {
        cdphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	base_str[i] = strdup(cdphone->basephone);
	left_str[i] = strdup(cdphone->leftcontext);
	right_str[i] = strdup(cdphone->rightcontext);
	posn_str[i] = strdup(cdphone->wordposition);
	free_heapelement(cdphone);
    }
    if (cdheapsize != 0) 
        E_FATAL("Error in CD heap! Error in dictionary or phone list!\n");

    for (i = 0, k = 0; i < n_total; i++)
        for (j = 0; j < n_state_pm-1; j++)
            smap[i][j] = k++;

    acmod_set = acmod_set_new();

    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    for (i = 0; i < n_base; i++) {
        if (base_str[i][0] == '+') {
            base = acmod_set_add_ci(acmod_set, base_str[i], filler_attr);
        }
        else {
            base = acmod_set_add_ci(acmod_set, base_str[i], base_attr);
        }
        tmat[base] = base;
    }

    for (; i < n_total; i++) {
        if ((base = acmod_set_name2id(acmod_set, base_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad basephone %s in triphone list!\n",base_str[i]);
        if ((left = acmod_set_name2id(acmod_set, left_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n",left_str[i]);
        if ((right = acmod_set_name2id(acmod_set, right_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n",right_str[i]);

	posn = posnstr2wordpos(posn_str[i]);

        acmod_set_add_tri(acmod_set, base, left, right, posn, na_attr);
        tmat[i] = base;
    }

    if ((fp = fopen(mdeffile, "w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",mdeffile);
    output_model_def(fp,
             pgm,
             base_str, left_str, right_str, posn_str, tmat, smap,
             n_base, n_tri, n_total, n_state_pm,
             n_tied_state_ci+n_tied_state_cd, n_tied_state_ci, n_tied_tmat);
    fclose(fp);
    E_INFO("Wrote mdef file %s\n",mdeffile);

    for (j = 0; j < n_tri; j++,i++) {
	if (base_str[j] != NULL) free(base_str[j]);
	if (left_str[j] != NULL) free(left_str[j]);
	if (right_str[j] != NULL) free(right_str[j]);
	if (posn_str[j] != NULL) free(posn_str[j]);
    }
    free(base_str); free(left_str); free(right_str); free(posn_str);
    ckd_free_2d((void**)smap);

    return 0;
}